

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  char *pcVar4;
  byte bVar5;
  ushort uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ushort uVar9;
  char cVar10;
  uint uVar11;
  ulong __n;
  char *pcVar12;
  LZ4_byte *pLVar13;
  long lVar14;
  size_t __n_00;
  char *pcVar15;
  BYTE *e;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  char *__src;
  BYTE *d_1;
  char *pcVar19;
  ulong __n_01;
  int iVar20;
  ushort *__src_00;
  ushort *puVar21;
  int local_a8;
  int local_90;
  char *local_38;
  
  uVar16 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar16 == 0) {
    uVar11 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
LAB_0037ab7c:
    if (0 < (int)uVar11) {
      (LZ4_streamDecode->internal_donotuse).prefixSize = (ulong)uVar11;
      (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar11);
    }
    return uVar11;
  }
  if ((LZ4_streamDecode->internal_donotuse).prefixEnd != (LZ4_byte *)dest) {
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar16;
    pLVar13 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar16;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar13;
    uVar11 = LZ4_decompress_safe_forceExtDict
                       (source,dest,compressedSize,maxOutputSize,pLVar13,uVar16);
    goto LAB_0037ab7c;
  }
  if (uVar16 < 0xffff) {
    uVar7 = (LZ4_streamDecode->internal_donotuse).extDictSize;
    if (uVar7 != 0) {
      __src_00 = (ushort *)0xffffffff;
      if (-1 < maxOutputSize && source != (char *)0x0) {
        pLVar13 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar7;
        if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
          pLVar13 = (LZ4_byte *)0x0;
        }
        if (maxOutputSize == 0) {
          if (compressedSize == 1) {
            __src_00 = (ushort *)(ulong)-(uint)(*source != '\0');
          }
        }
        else if (compressedSize != 0) {
          __src = dest + -uVar16;
          pbVar2 = (byte *)(source + compressedSize);
          pcVar3 = dest + (uint)maxOutputSize;
          pcVar1 = pcVar3 + -7;
          pcVar18 = dest;
          puVar21 = (ushort *)source;
LAB_0037a7a8:
          __src_00 = (ushort *)((long)puVar21 + 1);
          bVar5 = (byte)*puVar21;
          __n_00 = (size_t)(uint)(bVar5 >> 4);
          if (bVar5 >> 4 == 0xf) {
            lVar14 = -1;
            if (__src_00 < pbVar2 + -0xf) {
              lVar14 = 0;
              puVar21 = puVar21 + 1;
              do {
                __src_00 = puVar21;
                if (pbVar2 + -0xf < __src_00) {
                  lVar14 = -1;
                  break;
                }
                lVar14 = lVar14 + (ulong)*(byte *)((long)__src_00 + -1);
                puVar21 = (ushort *)((long)__src_00 + 1);
              } while ((ulong)*(byte *)((long)__src_00 + -1) == 0xff);
            }
            cVar10 = '\x05';
            if (lVar14 == -1) {
              __n_00 = 0xf;
            }
            else {
              __n_00 = lVar14 + 0xf;
              if (!CARRY8((ulong)pcVar18,__n_00)) {
                cVar10 = CARRY8((ulong)__src_00,__n_00) * '\x05';
              }
            }
            if (cVar10 != '\0') {
              if (cVar10 == '\x05') goto LAB_0037ab43;
              goto LAB_0037abbb;
            }
LAB_0037a88b:
            pcVar19 = pcVar18 + __n_00;
            if ((pcVar3 + -0xc < pcVar19) ||
               (puVar21 = (ushort *)((long)__src_00 + __n_00), pbVar2 + -8 < puVar21)) {
              if (((byte *)((long)__src_00 + __n_00) != pbVar2) || (pcVar3 < pcVar19))
              goto LAB_0037ab43;
              memmove(pcVar18,__src_00,__n_00);
              local_90 = (int)dest;
              __src_00 = (ushort *)(ulong)(uint)((int)pcVar19 - local_90);
              goto LAB_0037abbb;
            }
            do {
              *(undefined8 *)pcVar18 = *(undefined8 *)__src_00;
              pcVar18 = pcVar18 + 8;
              __src_00 = __src_00 + 4;
            } while (pcVar18 < pcVar19);
            uVar6 = *puVar21;
            __src_00 = puVar21 + 1;
            pcVar17 = pcVar19 + -(ulong)uVar6;
            uVar16 = (ulong)(bVar5 & 0xf);
          }
          else {
            if ((source + (long)compressedSize + -0x10 <= __src_00) ||
               (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar18)) goto LAB_0037a88b;
            uVar8 = *(undefined8 *)((long)puVar21 + 9);
            *(undefined8 *)pcVar18 = *(undefined8 *)__src_00;
            *(undefined8 *)(pcVar18 + 8) = uVar8;
            pcVar19 = pcVar18 + __n_00;
            uVar16 = (ulong)(bVar5 & 0xf);
            puVar21 = (ushort *)((long)__src_00 + __n_00);
            __src_00 = puVar21 + 1;
            uVar6 = *puVar21;
            pcVar17 = pcVar19 + -(ulong)uVar6;
            if ((uVar16 != 0xf) && ((7 < uVar6 && (__src <= pcVar17)))) {
              *(undefined8 *)pcVar19 = *(undefined8 *)pcVar17;
              *(undefined8 *)(pcVar19 + 8) = *(undefined8 *)(pcVar17 + 8);
              *(undefined2 *)(pcVar19 + 0x10) = *(undefined2 *)(pcVar17 + 0x10);
              pcVar18 = pcVar19 + uVar16 + 4;
              puVar21 = __src_00;
              goto LAB_0037a7a8;
            }
          }
          if ((int)uVar16 == 0xf) {
            lVar14 = 0;
            puVar21 = __src_00;
            do {
              __src_00 = (ushort *)((long)puVar21 + 1);
              if (pbVar2 + -4 < __src_00) {
                lVar14 = -1;
                break;
              }
              uVar9 = *puVar21;
              lVar14 = lVar14 + (ulong)(byte)uVar9;
              puVar21 = __src_00;
            } while ((ulong)(byte)uVar9 == 0xff);
            uVar16 = lVar14 + 0xf;
            if ((lVar14 == -1) || (CARRY8((ulong)pcVar19,uVar16))) goto LAB_0037ab43;
          }
          if ((uVar7 < 0x10000) && (pcVar17 + uVar7 < __src)) goto LAB_0037ab43;
          uVar16 = uVar16 + 4;
          pcVar4 = pcVar19 + uVar16;
          pcVar18 = pcVar4;
          puVar21 = __src_00;
          if (pcVar17 < __src) {
            if (pcVar3 + -5 < pcVar4) goto LAB_0037ab43;
            __n_01 = (long)__src - (long)pcVar17;
            __n = uVar16 - __n_01;
            if (uVar16 < __n_01 || __n == 0) {
              memmove(pcVar19,pLVar13 + -__n_01,uVar16);
            }
            else {
              memcpy(pcVar19,pLVar13 + -__n_01,__n_01);
              pcVar18 = pcVar19 + __n_01;
              if ((ulong)((long)pcVar18 - (long)__src) < __n) {
                pcVar19 = __src;
                if ((long)__n_01 < (long)uVar16) {
                  do {
                    *pcVar18 = *pcVar19;
                    pcVar18 = pcVar18 + 1;
                    pcVar19 = pcVar19 + 1;
                  } while (pcVar18 < pcVar4);
                }
              }
              else {
                memcpy(pcVar18,__src,__n);
                pcVar18 = pcVar4;
              }
            }
            goto LAB_0037a7a8;
          }
          if (uVar6 < 8) {
            LZ4_decompress_safe_continue_cold_1();
            pcVar17 = local_38;
          }
          else {
            *(undefined8 *)pcVar19 = *(undefined8 *)pcVar17;
            pcVar17 = pcVar17 + 8;
          }
          pcVar12 = pcVar19 + 8;
          if (pcVar4 <= pcVar3 + -0xc) {
            *(undefined8 *)pcVar12 = *(undefined8 *)pcVar17;
            if (0x10 < uVar16) {
              pcVar19 = pcVar19 + 0x10;
              do {
                pcVar17 = pcVar17 + 8;
                *(undefined8 *)pcVar19 = *(undefined8 *)pcVar17;
                pcVar19 = pcVar19 + 8;
              } while (pcVar19 < pcVar4);
            }
            goto LAB_0037a7a8;
          }
          iVar20 = 5;
          if (pcVar4 <= pcVar3 + -5) {
            pcVar19 = pcVar17;
            pcVar15 = pcVar12;
            if (pcVar12 < pcVar1) {
              do {
                *(undefined8 *)pcVar15 = *(undefined8 *)pcVar19;
                pcVar15 = pcVar15 + 8;
                pcVar19 = pcVar19 + 8;
              } while (pcVar15 < pcVar1);
              pcVar17 = pcVar17 + ((long)pcVar1 - (long)pcVar12);
              pcVar12 = pcVar1;
            }
            iVar20 = 0;
            for (; pcVar12 < pcVar4; pcVar12 = pcVar12 + 1) {
              cVar10 = *pcVar17;
              pcVar17 = pcVar17 + 1;
              *pcVar12 = cVar10;
            }
          }
          if (iVar20 == 0) goto LAB_0037a7a8;
          if (iVar20 == 5) {
LAB_0037ab43:
            local_a8 = (int)source;
            __src_00 = (ushort *)(ulong)(~(uint)__src_00 + local_a8);
          }
        }
      }
      goto LAB_0037abbb;
    }
    uVar11 = LZ4_decompress_safe_withSmallPrefix(source,dest,compressedSize,maxOutputSize,uVar16);
  }
  else {
    uVar11 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
  }
  __src_00 = (ushort *)(ulong)uVar11;
LAB_0037abbb:
  iVar20 = (int)__src_00;
  if (iVar20 < 1) {
    return iVar20;
  }
  (LZ4_streamDecode->internal_donotuse).prefixSize =
       (LZ4_streamDecode->internal_donotuse).prefixSize + ((ulong)__src_00 & 0xffffffff);
  (LZ4_streamDecode->internal_donotuse).prefixEnd =
       (LZ4_streamDecode->internal_donotuse).prefixEnd + ((ulong)__src_00 & 0xffffffff);
  return iVar20;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}